

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O3

PreservedAnalyses * __thiscall
Flatten::run(PreservedAnalyses *__return_storage_ptr__,Flatten *this,Module *M,
            ModuleAnalysisManager *AM)

{
  void **ppvVar1;
  FunctionPass *pFVar2;
  bool bVar3;
  bool bVar4;
  CallGraphNode *pCVar5;
  Flatten *pFVar6;
  Module *F;
  Flatten *pFVar7;
  Flatten *pFVar8;
  Flatten *this_00;
  Module *pMVar9;
  SmallSetVector<llvm::Function_*,_4U> ModifiedFunctions;
  CallGraph CG;
  value_type local_e8;
  Module *local_e0;
  Flatten *local_d8;
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  local_d0;
  CallGraph local_78 [16];
  Flatten local_68;
  
  local_d0.set_.
  super_DenseSetImpl<llvm::Function_*,_llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::DenseMapInfo<llvm::Function_*,_void>_>
  .TheMap._0_4_ = 0xffffffff;
  local_d8 = this;
  llvm::
  DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::Function_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
  ::initEmpty((DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::Function_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
               *)&local_d0);
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.BeginX
       = &local_d0.vector_.super_SmallVectorStorage<llvm::Function_*,_4U>;
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.Size =
       0;
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.
  Capacity = 4;
  bVar4 = false;
  local_e0 = M;
LAB_00115029:
  pMVar9 = local_e0;
  llvm::CallGraph::CallGraph(local_78,local_e0);
  pMVar9 = *(Module **)(pMVar9 + 0x20);
  do {
    if (pMVar9 == M + 0x18) {
      llvm::CallGraph::~CallGraph(local_78);
      if (bVar4) {
        (__return_storage_ptr__->PreservedIDs).SmallStorage[1] = (void *)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.SmallArray = (void **)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArray = (void **)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArraySize = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.NumNonEmpty = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->NotPreservedAnalysisIDs).
          super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumTombstones = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[0] = (void *)0x0;
        *(undefined8 *)
         &(__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
          super_SmallPtrSetImplBase.NumTombstones = 0;
        (__return_storage_ptr__->PreservedIDs).SmallStorage[0] = (void *)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[1] = (void *)0x0;
        ppvVar1 = (__return_storage_ptr__->PreservedIDs).SmallStorage;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.SmallArray = ppvVar1;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArray = ppvVar1;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArraySize = 2;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.NumNonEmpty = 0;
        ppvVar1 = (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.SmallArray = ppvVar1;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArray = ppvVar1;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArraySize = 2;
      }
      else {
        llvm::PreservedAnalyses::all();
      }
      if ((SmallVectorStorage<llvm::Function_*,_4U> *)
          local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
          super_SmallVectorTemplateBase<llvm::Function_*,_true>.
          super_SmallVectorTemplateCommon<llvm::Function_*,_void>.
          super_SmallVectorBase<unsigned_int>.BeginX !=
          &local_d0.vector_.super_SmallVectorStorage<llvm::Function_*,_4U>) {
        free(local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
             super_SmallVectorTemplateBase<llvm::Function_*,_true>.
             super_SmallVectorTemplateCommon<llvm::Function_*,_void>.
             super_SmallVectorBase<unsigned_int>.BeginX);
      }
      llvm::
      SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
      ::deallocateBuckets((SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
                           *)&local_d0);
      return __return_storage_ptr__;
    }
    F = pMVar9 + -0x38;
    if (pMVar9 == (Module *)0x0) {
      F = (Module *)0x0;
    }
    pFVar7 = (Flatten *)
             local_68.functionsFromMain.
             super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &local_68;
    if ((Flatten *)
        local_68.functionsFromMain.
        super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start == (Flatten *)0x0) {
LAB_001151c4:
      __assert_fail("I != FunctionMap.end() && \"Function not in callgraph!\"",
                    "/usr/lib/llvm-14/include/llvm/Analysis/CallGraph.h",0x7a,
                    "CallGraphNode *llvm::CallGraph::operator[](const Function *)");
    }
    do {
      pFVar8 = this_00;
      pFVar6 = pFVar7;
      pFVar2 = pFVar6[1].reg2mem;
      this_00 = pFVar6;
      if (pFVar2 < F) {
        this_00 = pFVar8;
      }
      pFVar7 = (Flatten *)
               (&(pFVar6->functionsFromMain).
                 super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_finish)[pFVar2 < F];
    } while (pFVar7 != (Flatten *)0x0);
    if (this_00 == &local_68) goto LAB_001151c4;
    pFVar7 = pFVar6;
    if (pFVar2 < F) {
      pFVar7 = pFVar8;
    }
    if (F < pFVar7[1].reg2mem) goto LAB_001151c4;
    if (pFVar2 < F) {
      pFVar6 = pFVar8;
    }
    pCVar5 = getSingleCaller(this_00,local_78,
                             (CallGraphNode *)
                             pFVar6[1].functionsFromMain.
                             super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    if ((pCVar5 != (CallGraphNode *)0x0) &&
       (bVar3 = inlineFunction(local_d8,(Function *)F,*(Function **)(pCVar5 + 8)), bVar3)) break;
    pMVar9 = *(Module **)(pMVar9 + 8);
  } while( true );
  local_e8 = *(value_type *)(pCVar5 + 8);
  llvm::
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  ::insert(&local_d0,&local_e8);
  local_e8 = (value_type)F;
  llvm::
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  ::remove(&local_d0,(char *)&local_e8);
  llvm::CallGraph::~CallGraph(local_78);
  bVar4 = true;
  goto LAB_00115029;
}

Assistant:

llvm::PreservedAnalyses Flatten::run(Module &M, ModuleAnalysisManager &AM) {
  bool ModifiedAny = false;
  bool ModifiedOne = false;
  SmallSetVector<Function *, 4> ModifiedFunctions;

  // We keep running, inlining functions into other functions, until there's
  // no work left to do.
  do {
    ModifiedOne = false;

    // Build the call graph of the entire module.
    CallGraph CG(M);

    for (Function &F : M.functions()) {
      CallGraphNode *CGN = CG[&F];
      CallGraphNode *Caller = getSingleCaller(CG, CGN);

      if (Caller == nullptr) {
        continue; // We need a function with a single caller function
      }

      if (inlineFunction(&F, Caller->getFunction())) {
        // Keep track of functions that need reg2mem
        ModifiedFunctions.insert(Caller->getFunction());
        ModifiedFunctions.remove(&F);

        // Mark the module as modified and start over
        ModifiedOne = true;
        ModifiedAny = true;
        break;
      }
    }

  } while (ModifiedOne);

  if (ModifiedAny) {
    return llvm::PreservedAnalyses::none();
  }
  return llvm::PreservedAnalyses::all();
}